

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O3

void __thiscall
t_markdown_generator::print_fn_args_doc(t_markdown_generator *this,t_function *tfunction)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  pointer pptVar4;
  pointer pptVar5;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  string local_88;
  vector<t_field_*,_std::allocator<t_field_*>_> local_68;
  t_function *local_50;
  vector<t_field_*,_std::allocator<t_field_*>_> local_48;
  
  local_50 = tfunction;
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            (&local_48,&tfunction->arglist_->members_);
  pptVar5 = local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar4 = local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_0024217f:
    if ((((*pptVar4)->super_t_doc).has_doc_ != true) ||
       (((*pptVar4)->super_t_doc).doc_._M_string_length == 0)) goto LAB_0024218f;
    poVar1 = &this->f_out_;
    local_88._M_dataplus._M_p._0_1_ = 10;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,(char *)&local_88,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"* parameters:",0xd);
    local_88._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_88,1);
    if (pptVar5 !=
        local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar2 = 1;
      do {
        poVar3 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,". ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,((*pptVar5)->name_)._M_dataplus._M_p,((*pptVar5)->name_)._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," - ",3);
        escape_html(&local_88,this,&((*pptVar5)->super_t_doc).doc_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   (char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_)
                   ,local_88._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
            &local_88.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_))
          ;
        }
        local_88._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_88,1);
        pptVar5 = pptVar5 + 1;
        iVar2 = iVar2 + 1;
      } while (pptVar5 !=
               local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_88._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_88,1);
    goto LAB_002422c3;
  }
LAB_00242198:
  local_88._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,(char *)&local_88,1);
LAB_002422c3:
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            (&local_68,&local_50->xceptions_->members_);
  pptVar4 = local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar5 = local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (pptVar5 ==
        local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00242409;
    if ((((*pptVar5)->super_t_doc).has_doc_ == true) &&
       (((*pptVar5)->super_t_doc).doc_._M_string_length != 0)) break;
    pptVar5 = pptVar5 + 1;
  }
  poVar1 = &this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"* exceptions:",0xd);
  local_88._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_88,1);
  if (pptVar4 !=
      local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  * ",4);
      iVar2 = (*((*pptVar4)->type_->super_t_doc)._vptr_t_doc[3])();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,*(char **)CONCAT44(extraout_var,iVar2),
                 ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," - ",3);
      escape_html(&local_88,this,&((*pptVar4)->super_t_doc).doc_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 (char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                 local_88._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
          &local_88.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_));
      }
      local_88._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_88,1);
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_88._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_88,1);
LAB_00242409:
  if (local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
LAB_0024218f:
  pptVar4 = pptVar4 + 1;
  if (pptVar4 ==
      local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_00242198;
  goto LAB_0024217f;
}

Assistant:

void t_markdown_generator::print_fn_args_doc(t_function* tfunction) {
  bool has_docs = false;
  vector<t_field*> args = tfunction->get_arglist()->get_members();
  vector<t_field*>::iterator arg_iter = args.begin();
  if (arg_iter != args.end()) {
    for (; arg_iter != args.end(); arg_iter++) {
      if ((*arg_iter)->has_doc() && !(*arg_iter)->get_doc().empty()) {
        has_docs = true;
        break;
      }
    }
    if (has_docs) {
      arg_iter = args.begin();
      f_out_ << endl << "* parameters:" << endl;
      for (int n = 1; arg_iter != args.end(); ++arg_iter, ++n ) {
        f_out_ << n << ". " << (*arg_iter)->get_name();
        f_out_ << " - " << escape_html((*arg_iter)->get_doc());
        f_out_ << endl;
      }
      f_out_ << endl;
    }
  }
  if(!has_docs) 
    f_out_ << endl;

  has_docs = false;
  vector<t_field*> excepts = tfunction->get_xceptions()->get_members();
  vector<t_field*>::iterator ex_iter = excepts.begin();
  if (ex_iter != excepts.end()) {
    for (; ex_iter != excepts.end(); ++ex_iter) {
      if ((*ex_iter)->has_doc() && !(*ex_iter)->get_doc().empty()) {
        has_docs = true;
        break;
      }
    }
    if (has_docs) {
      ex_iter = excepts.begin();
      f_out_ << "* exceptions:" << endl;
      for (; ex_iter != excepts.end(); ex_iter++) {
        f_out_ << "  * " << (*ex_iter)->get_type()->get_name();
        f_out_ << " - ";
        f_out_ << escape_html((*ex_iter)->get_doc());
        f_out_ << endl;
      }
      f_out_ << endl;
    }
  }
}